

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_adt.c
# Opt level: O3

void * msocket_ary_shift(msocket_ary_t *self)

{
  void **ppvVar1;
  void *pvVar2;
  int iVar3;
  
  if (self == (msocket_ary_t *)0x0) {
    __assert_fail("(self != 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/msocket/src/msocket_adt.c"
                  ,0xde,"void *msocket_ary_shift(msocket_ary_t *)");
  }
  if (self->s32CurLen != 0) {
    ppvVar1 = self->pFirst;
    self->pFirst = ppvVar1 + 1;
    pvVar2 = *ppvVar1;
    iVar3 = self->s32CurLen + -1;
    self->s32CurLen = iVar3;
    if (iVar3 != 0) {
      return pvVar2;
    }
    self->pFirst = self->ppAlloc;
    return pvVar2;
  }
  return (void *)0x0;
}

Assistant:

void* msocket_ary_shift(msocket_ary_t* self) {
   void* pElem;
   assert((self != 0));
   if (self->s32CurLen == 0) {
      return (void*)0;
   }
   pElem = *(self->pFirst++); //move pFirst forward by 1
   self->s32CurLen--; //reduce array length by 1
   if (self->s32CurLen == 0) {
      //reallign pFirst with pAlloc when buffer becomes empty
      self->pFirst = self->ppAlloc;
   }
   return pElem;
}